

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O0

uint32_t FACT3DInitialize(FACTAudioEngine *pEngine,uint8_t *F3DInstance)

{
  FACTAudioEngine *in_RDI;
  FAudioWaveFormatExtensible wfxFinalMixFormat;
  float nSpeedOfSound;
  FAudioWaveFormatExtensible *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb8;
  uint16_t in_stack_ffffffffffffffbe;
  FACTAudioEngine *in_stack_ffffffffffffffc0;
  
  if (in_RDI != (FACTAudioEngine *)0x0) {
    FACTAudioEngine_GetGlobalVariableIndex
              ((FACTAudioEngine *)CONCAT26(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8),
               (char *)in_RDI);
    FACTAudioEngine_GetGlobalVariable
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,(float *)in_RDI);
    FACTAudioEngine_GetFinalMixFormat(in_RDI,in_stack_ffffffffffffffa8);
    F3DAudioInitialize((uint32_t)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
                       (uint8_t *)in_stack_ffffffffffffffa8);
  }
  return 0;
}

Assistant:

uint32_t FACT3DInitialize(
	FACTAudioEngine *pEngine,
	F3DAUDIO_HANDLE F3DInstance
) {
	float nSpeedOfSound;
	FAudioWaveFormatExtensible wfxFinalMixFormat;

	if (pEngine == NULL)
	{
		return 0;
	}

	FACTAudioEngine_GetGlobalVariable(
		pEngine,
		FACTAudioEngine_GetGlobalVariableIndex(
			pEngine,
			"SpeedOfSound"
		),
		&nSpeedOfSound
	);
	FACTAudioEngine_GetFinalMixFormat(
		pEngine,
		&wfxFinalMixFormat
	);
	F3DAudioInitialize(
		wfxFinalMixFormat.dwChannelMask,
		nSpeedOfSound,
		F3DInstance
	);
	return 0;
}